

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O0

int kvsprintf(kstring_t *s,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  int local_3c;
  undefined8 uStack_38;
  int l;
  va_list args;
  __va_list_tag *ap_local;
  char *fmt_local;
  kstring_t *s_local;
  
  args[0].overflow_arg_area = ap->reg_save_area;
  uStack_38._0_4_ = ap->gp_offset;
  uStack_38._4_4_ = ap->fp_offset;
  args[0]._0_8_ = ap->overflow_arg_area;
  args[0].reg_save_area = ap;
  local_3c = vsnprintf(s->s + s->l,s->m - s->l,fmt,&uStack_38);
  if (s->m - s->l < (ulong)(long)(local_3c + 1)) {
    s->m = s->l + (long)local_3c + 2;
    s->m = s->m - 1;
    s->m = s->m >> 1 | s->m;
    s->m = s->m >> 2 | s->m;
    s->m = s->m >> 4 | s->m;
    s->m = s->m >> 8 | s->m;
    s->m = s->m >> 0x10 | s->m;
    s->m = s->m + 1;
    pcVar1 = (char *)realloc(s->s,s->m);
    s->s = pcVar1;
    args[0].overflow_arg_area = *(void **)((long)args[0].reg_save_area + 0x10);
    uStack_38 = *args[0].reg_save_area;
    args[0]._0_8_ = *(undefined8 *)((long)args[0].reg_save_area + 8);
    local_3c = vsnprintf(s->s + s->l,s->m - s->l,fmt,&uStack_38);
  }
  s->l = (long)local_3c + s->l;
  return local_3c;
}

Assistant:

int kvsprintf(kstring_t *s, const char *fmt, va_list ap)
{
	va_list args;
	int l;
	va_copy(args, ap);
	l = vsnprintf(s->s + s->l, s->m - s->l, fmt, args); // This line does not work with glibc 2.0. See `man snprintf'.
	va_end(args);
	if (l + 1 > s->m - s->l) {
		s->m = s->l + l + 2;
		kroundup32(s->m);
		s->s = (char*)realloc(s->s, s->m);
		va_copy(args, ap);
		l = vsnprintf(s->s + s->l, s->m - s->l, fmt, args);
		va_end(args);
	}
	s->l += l;
	return l;
}